

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

string * minja::capitalize(string *s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  string *in_RSI;
  string *in_RDI;
  string *result;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    iVar1 = toupper((int)*pcVar3);
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *puVar4 = (char)iVar1;
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

static std::string capitalize(const std::string & s) {
  if (s.empty()) return s;
  auto result = s;
  result[0] = std::toupper(result[0]);
  return result;
}